

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,int value)

{
  uint uVar1;
  int iVar2;
  ZSTD_CCtx_params *pZVar3;
  size_t err_code_4;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  ZSTD_literalCompressionMode_e lcm;
  ZSTD_dictAttachPref_e pref;
  size_t err_code;
  int value_local;
  ZSTD_cParameter param_local;
  ZSTD_CCtx_params *CCtxParams_local;
  
  err_code._0_4_ = value;
  err_code._4_4_ = param;
  _value_local = CCtxParams;
  if (param == ZSTD_c_experimentalParam2) {
    iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam2,value);
    if (iVar2 == 0) {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
    else {
      _value_local->format = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)_value_local->format;
    }
  }
  else if (param == ZSTD_c_compressionLevel) {
    pZVar3 = (ZSTD_CCtx_params *)ZSTD_cParam_clampBounds(ZSTD_c_compressionLevel,(int *)&err_code);
    uVar1 = ERR_isError((size_t)pZVar3);
    CCtxParams_local = pZVar3;
    if (uVar1 == 0) {
      if ((ZSTD_format_e)err_code != 0) {
        _value_local->compressionLevel = (ZSTD_format_e)err_code;
      }
      if (_value_local->compressionLevel < 0) {
        CCtxParams_local = (ZSTD_CCtx_params *)0x0;
      }
      else {
        CCtxParams_local = (ZSTD_CCtx_params *)(long)_value_local->compressionLevel;
      }
    }
  }
  else if (param == ZSTD_c_windowLog) {
    if ((value == 0) || (iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_windowLog,value), iVar2 != 0)) {
      (_value_local->cParams).windowLog = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(_value_local->cParams).windowLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_hashLog) {
    if ((value == 0) || (iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_hashLog,value), iVar2 != 0)) {
      (_value_local->cParams).hashLog = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(_value_local->cParams).hashLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_chainLog) {
    if ((value == 0) || (iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_chainLog,value), iVar2 != 0)) {
      (_value_local->cParams).chainLog = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(_value_local->cParams).chainLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_searchLog) {
    if ((value == 0) || (iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_searchLog,value), iVar2 != 0)) {
      (_value_local->cParams).searchLog = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(long)(int)(ZSTD_format_e)err_code;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_minMatch) {
    if ((value == 0) || (iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_minMatch,value), iVar2 != 0)) {
      (_value_local->cParams).minMatch = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(_value_local->cParams).minMatch;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_targetLength) {
    iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_targetLength,value);
    if (iVar2 == 0) {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
    else {
      (_value_local->cParams).targetLength = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(_value_local->cParams).targetLength;
    }
  }
  else if (param == ZSTD_c_strategy) {
    if ((value == 0) || (iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_strategy,value), iVar2 != 0)) {
      (_value_local->cParams).strategy = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(_value_local->cParams).strategy;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_enableLongDistanceMatching) {
    (CCtxParams->ldmParams).enableLdm = (uint)(value != 0);
    CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->ldmParams).enableLdm;
  }
  else if (param == ZSTD_c_ldmHashLog) {
    if ((value == 0) || (iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_ldmHashLog,value), iVar2 != 0)) {
      (_value_local->ldmParams).hashLog = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(_value_local->ldmParams).hashLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_ldmMinMatch) {
    if ((value == 0) || (iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_ldmMinMatch,value), iVar2 != 0)) {
      (_value_local->ldmParams).minMatchLength = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(_value_local->ldmParams).minMatchLength;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_ldmBucketSizeLog) {
    if ((value == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_ldmBucketSizeLog,value), iVar2 != 0)) {
      (_value_local->ldmParams).bucketSizeLog = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(_value_local->ldmParams).bucketSizeLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_ldmHashRateLog) {
    if (value < 0x1a) {
      (CCtxParams->ldmParams).hashRateLog = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->ldmParams).hashRateLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_contentSizeFlag) {
    (CCtxParams->fParams).contentSizeFlag = (uint)(value != 0);
    CCtxParams_local = (ZSTD_CCtx_params *)(long)(CCtxParams->fParams).contentSizeFlag;
  }
  else if (param == ZSTD_c_checksumFlag) {
    (CCtxParams->fParams).checksumFlag = (uint)(value != 0);
    CCtxParams_local = (ZSTD_CCtx_params *)(long)(CCtxParams->fParams).checksumFlag;
  }
  else if (param == ZSTD_c_dictIDFlag) {
    (CCtxParams->fParams).noDictIDFlag = (uint)((value != 0 ^ 0xffU) & 1);
    CCtxParams_local =
         (ZSTD_CCtx_params *)(ulong)(((CCtxParams->fParams).noDictIDFlag != 0 ^ 0xffU) & 1);
  }
  else if (param == ZSTD_c_nbWorkers) {
    pZVar3 = (ZSTD_CCtx_params *)ZSTD_cParam_clampBounds(ZSTD_c_nbWorkers,(int *)&err_code);
    uVar1 = ERR_isError((size_t)pZVar3);
    CCtxParams_local = pZVar3;
    if (uVar1 == 0) {
      _value_local->nbWorkers = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(long)_value_local->nbWorkers;
    }
  }
  else if (param == ZSTD_c_jobSize) {
    if ((value != 0) && (value < 0x100000)) {
      err_code._0_4_ = 0x100000;
    }
    pZVar3 = (ZSTD_CCtx_params *)ZSTD_cParam_clampBounds(ZSTD_c_jobSize,(int *)&err_code);
    uVar1 = ERR_isError((size_t)pZVar3);
    CCtxParams_local = pZVar3;
    if (uVar1 == 0) {
      if ((int)(ZSTD_format_e)err_code < 0) {
        __assert_fail("value >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2cce,
                      "size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params *, ZSTD_cParameter, int)"
                     );
      }
      _value_local->jobSize = (long)(int)(ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)_value_local->jobSize;
    }
  }
  else if (param == ZSTD_c_overlapLog) {
    pZVar3 = (ZSTD_CCtx_params *)ZSTD_cParam_clampBounds(ZSTD_c_overlapLog,(int *)&err_code);
    uVar1 = ERR_isError((size_t)pZVar3);
    CCtxParams_local = pZVar3;
    if (uVar1 == 0) {
      _value_local->overlapLog = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(long)_value_local->overlapLog;
    }
  }
  else if (param == ZSTD_c_experimentalParam1) {
    pZVar3 = (ZSTD_CCtx_params *)ZSTD_cParam_clampBounds(ZSTD_c_overlapLog,(int *)&err_code);
    uVar1 = ERR_isError((size_t)pZVar3);
    CCtxParams_local = pZVar3;
    if (uVar1 == 0) {
      _value_local->rsyncable = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(long)_value_local->rsyncable;
    }
  }
  else if (param == ZSTD_c_experimentalParam3) {
    CCtxParams->forceWindow = (uint)(value != 0);
    CCtxParams_local = (ZSTD_CCtx_params *)(long)CCtxParams->forceWindow;
  }
  else if (param == ZSTD_c_experimentalParam4) {
    iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam4,value);
    if (iVar2 == 0) {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
    else {
      _value_local->attachDictPref = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)_value_local->attachDictPref;
    }
  }
  else if (param == ZSTD_c_experimentalParam5) {
    iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam5,value);
    if (iVar2 == 0) {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
    else {
      _value_local->literalCompressionMode = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)_value_local->literalCompressionMode;
    }
  }
  else if (param == ZSTD_c_experimentalParam6) {
    if ((value == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam6,value), iVar2 != 0)) {
      _value_local->targetCBlockSize = (long)(int)(ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)_value_local->targetCBlockSize;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_experimentalParam7) {
    if ((value == 0) ||
       (iVar2 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam7,value), iVar2 != 0)) {
      _value_local->srcSizeHint = (ZSTD_format_e)err_code;
      CCtxParams_local = (ZSTD_CCtx_params *)(long)_value_local->srcSizeHint;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else {
    CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd8;
  }
  return (size_t)CCtxParams_local;
}

Assistant:

size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params* CCtxParams,
                                    ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtxParams_setParameter (%i, %i)", (int)param, value);
    switch(param)
    {
    case ZSTD_c_format :
        BOUNDCHECK(ZSTD_c_format, value);
        CCtxParams->format = (ZSTD_format_e)value;
        return (size_t)CCtxParams->format;

    case ZSTD_c_compressionLevel : {
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value));
        if (value) {  /* 0 : does not change current level */
            CCtxParams->compressionLevel = value;
        }
        if (CCtxParams->compressionLevel >= 0) return (size_t)CCtxParams->compressionLevel;
        return 0;  /* return type (size_t) cannot represent negative values */
    }

    case ZSTD_c_windowLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_windowLog, value);
        CCtxParams->cParams.windowLog = (U32)value;
        return CCtxParams->cParams.windowLog;

    case ZSTD_c_hashLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_hashLog, value);
        CCtxParams->cParams.hashLog = (U32)value;
        return CCtxParams->cParams.hashLog;

    case ZSTD_c_chainLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_chainLog, value);
        CCtxParams->cParams.chainLog = (U32)value;
        return CCtxParams->cParams.chainLog;

    case ZSTD_c_searchLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_searchLog, value);
        CCtxParams->cParams.searchLog = (U32)value;
        return (size_t)value;

    case ZSTD_c_minMatch :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_minMatch, value);
        CCtxParams->cParams.minMatch = value;
        return CCtxParams->cParams.minMatch;

    case ZSTD_c_targetLength :
        BOUNDCHECK(ZSTD_c_targetLength, value);
        CCtxParams->cParams.targetLength = value;
        return CCtxParams->cParams.targetLength;

    case ZSTD_c_strategy :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_strategy, value);
        CCtxParams->cParams.strategy = (ZSTD_strategy)value;
        return (size_t)CCtxParams->cParams.strategy;

    case ZSTD_c_contentSizeFlag :
        /* Content size written in frame header _when known_ (default:1) */
        DEBUGLOG(4, "set content size flag = %u", (value!=0));
        CCtxParams->fParams.contentSizeFlag = value != 0;
        return CCtxParams->fParams.contentSizeFlag;

    case ZSTD_c_checksumFlag :
        /* A 32-bits content checksum will be calculated and written at end of frame (default:0) */
        CCtxParams->fParams.checksumFlag = value != 0;
        return CCtxParams->fParams.checksumFlag;

    case ZSTD_c_dictIDFlag : /* When applicable, dictionary's dictID is provided in frame header (default:1) */
        DEBUGLOG(4, "set dictIDFlag = %u", (value!=0));
        CCtxParams->fParams.noDictIDFlag = !value;
        return !CCtxParams->fParams.noDictIDFlag;

    case ZSTD_c_forceMaxWindow :
        CCtxParams->forceWindow = (value != 0);
        return CCtxParams->forceWindow;

    case ZSTD_c_forceAttachDict : {
        const ZSTD_dictAttachPref_e pref = (ZSTD_dictAttachPref_e)value;
        BOUNDCHECK(ZSTD_c_forceAttachDict, pref);
        CCtxParams->attachDictPref = pref;
        return CCtxParams->attachDictPref;
    }

    case ZSTD_c_literalCompressionMode : {
        const ZSTD_literalCompressionMode_e lcm = (ZSTD_literalCompressionMode_e)value;
        BOUNDCHECK(ZSTD_c_literalCompressionMode, lcm);
        CCtxParams->literalCompressionMode = lcm;
        return CCtxParams->literalCompressionMode;
    }

    case ZSTD_c_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value));
        CCtxParams->nbWorkers = value;
        return CCtxParams->nbWorkers;
#endif

    case ZSTD_c_jobSize :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        /* Adjust to the minimum non-default value. */
        if (value != 0 && value < ZSTDMT_JOBSIZE_MIN)
            value = ZSTDMT_JOBSIZE_MIN;
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value));
        assert(value >= 0);
        CCtxParams->jobSize = value;
        return CCtxParams->jobSize;
#endif

    case ZSTD_c_overlapLog :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(ZSTD_c_overlapLog, &value));
        CCtxParams->overlapLog = value;
        return CCtxParams->overlapLog;
#endif

    case ZSTD_c_rsyncable :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(ZSTD_c_overlapLog, &value));
        CCtxParams->rsyncable = value;
        return CCtxParams->rsyncable;
#endif

    case ZSTD_c_enableLongDistanceMatching :
        CCtxParams->ldmParams.enableLdm = (value!=0);
        return CCtxParams->ldmParams.enableLdm;

    case ZSTD_c_ldmHashLog :
        if (value!=0)   /* 0 ==> auto */
            BOUNDCHECK(ZSTD_c_ldmHashLog, value);
        CCtxParams->ldmParams.hashLog = value;
        return CCtxParams->ldmParams.hashLog;

    case ZSTD_c_ldmMinMatch :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmMinMatch, value);
        CCtxParams->ldmParams.minMatchLength = value;
        return CCtxParams->ldmParams.minMatchLength;

    case ZSTD_c_ldmBucketSizeLog :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmBucketSizeLog, value);
        CCtxParams->ldmParams.bucketSizeLog = value;
        return CCtxParams->ldmParams.bucketSizeLog;

    case ZSTD_c_ldmHashRateLog :
        RETURN_ERROR_IF(value > ZSTD_WINDOWLOG_MAX - ZSTD_HASHLOG_MIN,
                        parameter_outOfBound);
        CCtxParams->ldmParams.hashRateLog = value;
        return CCtxParams->ldmParams.hashRateLog;

    case ZSTD_c_targetCBlockSize :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_targetCBlockSize, value);
        CCtxParams->targetCBlockSize = value;
        return CCtxParams->targetCBlockSize;

    case ZSTD_c_srcSizeHint :
        if (value!=0)    /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_srcSizeHint, value);
        CCtxParams->srcSizeHint = value;
        return CCtxParams->srcSizeHint;

    default: RETURN_ERROR(parameter_unsupported, "unknown parameter");
    }
}